

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall ConfigurationTest::SetUp(ConfigurationTest *this)

{
  byte bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ostream local_280 [8];
  ofstream of;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  unsigned_long local_18;
  uint64_t ts;
  ConfigurationTest *this_local;
  
  ts = (uint64_t)this;
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_30);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
  std::__cxx11::to_string(&local_70,local_18);
  std::operator+(&local_50,"ConfigurationTest.",&local_70);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::ofstream::ofstream(local_280,&this->filename,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_2a0,"Can\'t create a temporary file: ",&this->filename);
    std::runtime_error::runtime_error(this_00,(string *)&local_2a0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<(local_280,(string *)(anonymous_namespace)::propertyFileContent_abi_cxx11_);
  std::ofstream::close();
  setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT","123456",1);
  setenv("AERON_ARCHIVE_CONTROL_CHANNEL","qqqwwweee",1);
  setenv("AERON_ARCHIVE_CONTROL_STREAM_ID","42",1);
  setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL","ipc:aeron",1);
  setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID","314",1);
  setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL","ResponsEconTrol",1);
  setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID","271",1);
  setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL","aaaaassss",1);
  setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID","144",1);
  setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE","0",1);
  setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH","1024",1);
  setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH","1812",1);
  std::ofstream::~ofstream(local_280);
  return;
}

Assistant:

void SetUp() override {
        using namespace std::chrono;

        // generate an almost unique filename
        std::uint64_t ts = duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
        filename = "ConfigurationTest." + std::to_string(ts);

        std::ofstream of(filename);
        if (!of.is_open()) {
            throw std::runtime_error("Can't create a temporary file: " + filename);
        }

        of << propertyFileContent;
        of.close();

        // set env variables
        setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT", "123456", 1);
        setenv("AERON_ARCHIVE_CONTROL_CHANNEL", "qqqwwweee", 1);
        setenv("AERON_ARCHIVE_CONTROL_STREAM_ID", "42", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL", "ipc:aeron", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID", "314", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL", "ResponsEconTrol", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID", "271", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL", "aaaaassss", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID", "144", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE", "0", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH", "1024", 1);
        setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH", "1812", 1);
    }